

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O3

int lws_tls_fake_POLLIN_for_buffered(lws_context_per_thread *pt)

{
  ushort uVar1;
  pollfd *ppVar2;
  lws_dll2 *plVar3;
  ushort uVar4;
  long lVar5;
  ushort uVar6;
  
  plVar3 = (pt->tls).dll_pending_tls_owner.head;
  if (plVar3 != (lws_dll2 *)0x0) {
    uVar4 = 0;
    do {
      lVar5 = (long)*(int *)((long)&plVar3[4].prev + 4);
      plVar3 = plVar3->next;
      if (-1 < lVar5) {
        ppVar2 = pt->fds;
        uVar1 = ppVar2[lVar5].revents;
        uVar6 = ppVar2[lVar5].events & 1;
        ppVar2[lVar5].revents = uVar6 | uVar1;
        uVar4 = uVar4 | uVar6 | uVar1 & 1;
      }
    } while (plVar3 != (lws_dll2 *)0x0);
    return (int)(uVar4 != 0);
  }
  return 0;
}

Assistant:

int
lws_tls_fake_POLLIN_for_buffered(struct lws_context_per_thread *pt)
{
	int ret = 0;

	lws_start_foreach_dll_safe(struct lws_dll2 *, p, p1,
			lws_dll2_get_head(&pt->tls.dll_pending_tls_owner)) {
		struct lws *wsi = lws_container_of(p, struct lws,
						   tls.dll_pending_tls);

		if (wsi->position_in_fds_table >= 0) {

			pt->fds[wsi->position_in_fds_table].revents = (short)
				(pt->fds[wsi->position_in_fds_table].revents |
				 (pt->fds[wsi->position_in_fds_table].events & LWS_POLLIN));
			ret |= pt->fds[wsi->position_in_fds_table].revents & LWS_POLLIN;
		}

	} lws_end_foreach_dll_safe(p, p1);

	return !!ret;
}